

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O0

void iCopyColors<cRGB,cBGRA,bAdd>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  PalEntry PVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uchar uVar6;
  uchar uVar7;
  bool bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  int iVar12;
  int iVar13;
  FSpecialColormap *pFVar14;
  EBlend local_58;
  BYTE local_54;
  BYTE BStack_53;
  BYTE BStack_52;
  PalEntry pe;
  FSpecialColormap *cm;
  int gray_1;
  int a;
  int gray;
  BYTE b;
  BYTE g;
  int iStack_30;
  BYTE r;
  int fac;
  int i;
  BYTE tr_local;
  FCopyInfo *inf_local;
  int step_local;
  int count_local;
  BYTE *pin_local;
  BYTE *pout_local;
  
  if (inf == (FCopyInfo *)0x0) {
    local_58 = BLEND_NONE;
  }
  else {
    local_58 = inf->blend;
  }
  _step_local = pin;
  pin_local = pout;
  switch(local_58) {
  case BLEND_NONE:
    for (iStack_30 = 0; iStack_30 < count; iStack_30 = iStack_30 + 1) {
      uVar7 = cRGB::A(_step_local,tr,tg,tb);
      bVar8 = bAdd::ProcessAlpha0();
      if ((bVar8) || (uVar7 != '\0')) {
        uVar6 = cRGB::R(_step_local);
        bAdd::OpC(pin_local + 2,uVar6,uVar7,inf);
        uVar6 = cRGB::G(_step_local);
        bAdd::OpC(pin_local + 1,uVar6,uVar7,inf);
        uVar6 = cRGB::B(_step_local);
        bAdd::OpC(pin_local,uVar6,uVar7,inf);
        bAdd::OpA(pin_local + 3,uVar7,inf);
      }
      pin_local = pin_local + 4;
      _step_local = _step_local + step;
    }
    break;
  case BLEND_ICEMAP:
    for (iStack_30 = 0; iStack_30 < count; iStack_30 = iStack_30 + 1) {
      uVar7 = cRGB::A(_step_local,tr,tg,tb);
      bVar8 = bAdd::ProcessAlpha0();
      if ((bVar8) || (uVar7 != '\0')) {
        iVar12 = cRGB::Gray(_step_local);
        iVar12 = iVar12 >> 4;
        bAdd::OpC(pin_local + 2,IcePalette[iVar12][0],uVar7,inf);
        bAdd::OpC(pin_local + 1,IcePalette[iVar12][1],uVar7,inf);
        bAdd::OpC(pin_local,IcePalette[iVar12][2],uVar7,inf);
        bAdd::OpA(pin_local + 3,uVar7,inf);
      }
      pin_local = pin_local + 4;
      _step_local = _step_local + step;
    }
    break;
  case BLEND_OVERLAY:
    for (iStack_30 = 0; iStack_30 < count; iStack_30 = iStack_30 + 1) {
      uVar7 = cRGB::A(_step_local,tr,tg,tb);
      bVar8 = bAdd::ProcessAlpha0();
      if ((bVar8) || (uVar7 != '\0')) {
        bVar9 = cRGB::R(_step_local);
        iVar12 = inf->blendcolor[3];
        iVar13 = inf->blendcolor[0];
        bVar10 = cRGB::G(_step_local);
        iVar2 = inf->blendcolor[3];
        iVar3 = inf->blendcolor[1];
        bVar11 = cRGB::B(_step_local);
        iVar4 = inf->blendcolor[3];
        iVar5 = inf->blendcolor[2];
        bAdd::OpC(pin_local + 2,(BYTE)((uint)bVar9 * iVar12 + iVar13 >> 0x10),uVar7,inf);
        bAdd::OpC(pin_local + 1,(BYTE)((uint)bVar10 * iVar2 + iVar3 >> 0x10),uVar7,inf);
        bAdd::OpC(pin_local,(BYTE)((uint)bVar11 * iVar4 + iVar5 >> 0x10),uVar7,inf);
        bAdd::OpA(pin_local + 3,uVar7,inf);
      }
      pin_local = pin_local + 4;
      _step_local = _step_local + step;
    }
    break;
  case BLEND_MODULATE:
    for (iStack_30 = 0; iStack_30 < count; iStack_30 = iStack_30 + 1) {
      uVar7 = cRGB::A(_step_local,tr,tg,tb);
      bVar8 = bAdd::ProcessAlpha0();
      if ((bVar8) || (uVar7 != '\0')) {
        bVar9 = cRGB::R(_step_local);
        iVar12 = inf->blendcolor[0];
        bVar10 = cRGB::G(_step_local);
        iVar13 = inf->blendcolor[1];
        bVar11 = cRGB::B(_step_local);
        iVar2 = inf->blendcolor[2];
        bAdd::OpC(pin_local + 2,(BYTE)((uint)bVar9 * iVar12 >> 0x10),uVar7,inf);
        bAdd::OpC(pin_local + 1,(BYTE)((uint)bVar10 * iVar13 >> 0x10),uVar7,inf);
        bAdd::OpC(pin_local,(BYTE)((uint)bVar11 * iVar2 >> 0x10),uVar7,inf);
        bAdd::OpA(pin_local + 3,uVar7,inf);
      }
      pin_local = pin_local + 4;
      _step_local = _step_local + step;
    }
    break;
  default:
    if (inf->blend < BLEND_SPECIALCOLORMAP1) {
      if ((BLEND_ICEMAP < inf->blend) && (inf->blend < BLEND_SPECIALCOLORMAP1)) {
        iVar12 = inf->blend + BLEND_MODULATE;
        for (iStack_30 = 0; iStack_30 < count; iStack_30 = iStack_30 + 1) {
          uVar7 = cRGB::A(_step_local,tr,tg,tb);
          bVar8 = bAdd::ProcessAlpha0();
          if ((bVar8) || (uVar7 != '\0')) {
            iVar13 = cRGB::Gray(_step_local);
            bVar9 = cRGB::R(_step_local);
            bVar10 = cRGB::G(_step_local);
            bVar11 = cRGB::B(_step_local);
            bAdd::OpC(pin_local + 2,
                      (BYTE)((int)((uint)bVar9 * (0x1f - iVar12) + iVar13 * iVar12) / 0x1f),uVar7,
                      inf);
            bAdd::OpC(pin_local + 1,
                      (BYTE)((int)((uint)bVar10 * (0x1f - iVar12) + iVar13 * iVar12) / 0x1f),uVar7,
                      inf);
            bAdd::OpC(pin_local,
                      (BYTE)((int)((uint)bVar11 * (0x1f - iVar12) + iVar13 * iVar12) / 0x1f),uVar7,
                      inf);
            bAdd::OpA(pin_local + 3,uVar7,inf);
          }
          pin_local = pin_local + 4;
          _step_local = _step_local + step;
        }
      }
    }
    else {
      pFVar14 = TArray<FSpecialColormap,_FSpecialColormap>::operator[]
                          (&SpecialColormaps,(long)(inf->blend + ~BLEND_DESATURATE31));
      for (iStack_30 = 0; iStack_30 < count; iStack_30 = iStack_30 + 1) {
        uVar7 = cRGB::A(_step_local,tr,tg,tb);
        bVar8 = bAdd::ProcessAlpha0();
        if ((bVar8) || (uVar7 != '\0')) {
          iVar12 = cRGB::Gray(_step_local);
          iVar12 = clamp<int>(iVar12,0,0xff);
          PVar1.field_0 =
               (anon_union_4_2_12391d7c_for_PalEntry_0)
               *(anon_union_4_2_12391d7c_for_PalEntry_0 *)
                &pFVar14->GrayscaleToColor[iVar12].field_0.field_0;
          BStack_52 = PVar1.field_0._2_1_;
          bAdd::OpC(pin_local + 2,BStack_52,uVar7,inf);
          BStack_53 = PVar1.field_0._1_1_;
          bAdd::OpC(pin_local + 1,BStack_53,uVar7,inf);
          local_54 = PVar1.field_0._0_1_;
          bAdd::OpC(pin_local,local_54,uVar7,inf);
          bAdd::OpA(pin_local + 3,uVar7,inf);
        }
        pin_local = pin_local + 4;
        _step_local = _step_local + step;
      }
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}